

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3DeclareVtab(int *pRc,Fts3Table *p)

{
  int iVar1;
  char *p_00;
  char *pcVar2;
  char *zCreateTable;
  long lVar3;
  
  if (*pRc != 0) {
    return;
  }
  pcVar2 = "__langid";
  if (p->zLanguageid != (char *)0x0) {
    pcVar2 = p->zLanguageid;
  }
  sqlite3_vtab_config(p->db,1,1);
  sqlite3_vtab_config(p->db,2);
  p_00 = sqlite3_mprintf("%Q, ",*p->azColumn);
  if (p_00 != (char *)0x0) {
    lVar3 = 1;
    do {
      if (p->nColumn <= lVar3) {
        zCreateTable = sqlite3_mprintf("CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)",p_00,
                                       p->zName,pcVar2);
        pcVar2 = (char *)0x0;
        if (zCreateTable == (char *)0x0) goto LAB_001c8d0f;
        iVar1 = sqlite3_declare_vtab(p->db,zCreateTable);
        goto LAB_001c8d14;
      }
      p_00 = sqlite3_mprintf("%z%Q, ",p_00,p->azColumn[lVar3]);
      lVar3 = lVar3 + 1;
    } while (p_00 != (char *)0x0);
  }
  p_00 = (char *)0x0;
  pcVar2 = sqlite3_mprintf("CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)",0,p->zName,pcVar2
                          );
LAB_001c8d0f:
  zCreateTable = pcVar2;
  iVar1 = 7;
LAB_001c8d14:
  sqlite3_free(zCreateTable);
  sqlite3_free(p_00);
  *pRc = iVar1;
  return;
}

Assistant:

static void fts3DeclareVtab(int *pRc, Fts3Table *p){
  if( *pRc==SQLITE_OK ){
    int i;                        /* Iterator variable */
    int rc;                       /* Return code */
    char *zSql;                   /* SQL statement passed to declare_vtab() */
    char *zCols;                  /* List of user defined columns */
    const char *zLanguageid;

    zLanguageid = (p->zLanguageid ? p->zLanguageid : "__langid");
    sqlite3_vtab_config(p->db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);
    sqlite3_vtab_config(p->db, SQLITE_VTAB_INNOCUOUS);

    /* Create a list of user columns for the virtual table */
    zCols = sqlite3_mprintf("%Q, ", p->azColumn[0]);
    for(i=1; zCols && i<p->nColumn; i++){
      zCols = sqlite3_mprintf("%z%Q, ", zCols, p->azColumn[i]);
    }

    /* Create the whole "CREATE TABLE" statement to pass to SQLite */
    zSql = sqlite3_mprintf(
        "CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)",
        zCols, p->zName, zLanguageid
    );
    if( !zCols || !zSql ){
      rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3_declare_vtab(p->db, zSql);
    }

    sqlite3_free(zSql);
    sqlite3_free(zCols);
    *pRc = rc;
  }
}